

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_column_removal<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
               (void)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *column;
  Underlying_matrix *this;
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  _Hash_node_base *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Column_settings *pCVar9;
  Column_settings *pCVar10;
  pool<boost::default_user_allocator_malloc_free> *ppVar11;
  int dim;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  pointer witness;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_> m;
  key_equal local_2d0 [8];
  undefined8 local_2c8;
  shared_count sStack_2c0;
  allocator_type local_2b1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_2b0;
  undefined1 local_298 [8];
  pointer puStack_290;
  _Base_ptr local_288;
  char *local_280;
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_> local_260;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>
            ();
  ppVar11 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (ppVar11->super_simple_segregated_storage<unsigned_long>).first = (void *)0x0;
  (ppVar11->list).ptr = (char *)0x0;
  (ppVar11->list).sz = 0;
  ppVar11->requested_size = 0x18;
  ppVar11->next_size = 0x20;
  ppVar11->start_size = 0x20;
  ppVar11->max_size = 0;
  this = &local_260.matrix_;
  local_260.colSettings_ = (Column_settings *)ppVar11;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)this,((long)local_2b0.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_2b0.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
               (hash<unsigned_int> *)local_298,local_2d0,&local_2b1);
  local_260.matrix_.nextInsertIndex_ =
       (int)((ulong)((long)local_2b0.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_2b0.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  local_260.matrix_.colSettings_ = (Column_settings *)ppVar11;
  if (local_2b0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_2b0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar13 = 0;
    do {
      column = local_2b0.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar13;
      puVar2 = (column->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar3 = (column->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dim = (int)((ulong)((long)puVar2 - (long)puVar3) >> 2) + -1;
      if (puVar2 == puVar3) {
        dim = 0;
      }
      Gudhi::persistence_matrix::
      Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
      ::_container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
                  *)this,column,(Index)uVar13,dim);
      uVar13 = (ulong)((Index)uVar13 + 1);
      uVar12 = ((long)local_2b0.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_2b0.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar13 <= uVar12 && uVar12 - uVar13 != 0);
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
            (&local_2b0,&local_260);
  local_298._0_4_ = 2;
  if (local_260.matrix_.nextInsertIndex_ == 3) {
    local_260.matrix_.nextInsertIndex_ = 2;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)this,local_298);
  local_298._0_4_ = 4;
  if (local_260.matrix_.nextInsertIndex_ == 5) {
    local_260.matrix_.nextInsertIndex_ = 4;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)this,local_298);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x341);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_260.matrix_.matrix_._M_h._M_bucket_count;
  uVar13 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar5,0);
  if (local_260.matrix_.matrix_._M_h._M_buckets[uVar13 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var4 = local_260.matrix_.matrix_._M_h._M_buckets[uVar13 & 0xffffffff]->_M_nxt;
    uVar14 = *(uint *)&p_Var4[1]._M_nxt;
    do {
      if (uVar14 == 2) {
        local_60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_58 = "";
        local_70 = &boost::unit_test::basic_cstring<char_const>::null;
        local_68 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x341);
        local_2d0[0] = (key_equal)0x0;
        local_2c8 = 0;
        sStack_2c0.pi_ = (sp_counted_base *)0x0;
        puStack_290 = (pointer)((ulong)puStack_290 & 0xffffffffffffff00);
        local_298 = (undefined1  [8])&PTR__lazy_ostream_001b8810;
        local_288 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_280 = "exception std::logic_error expected but not raised";
        local_80 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_78 = "";
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_2c0);
        local_c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_b8 = "";
        local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x342);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_260.matrix_.matrix_._M_h._M_bucket_count;
        uVar13 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar6,0);
        if (local_260.matrix_.matrix_._M_h._M_buckets[uVar13 & 0xffffffff] != (__node_base_ptr)0x0)
        {
          p_Var4 = local_260.matrix_.matrix_._M_h._M_buckets[uVar13 & 0xffffffff]->_M_nxt;
          uVar14 = *(uint *)&p_Var4[1]._M_nxt;
          do {
            if (uVar14 == 4) {
              local_e0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_d8 = "";
              local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x342);
              local_2d0[0] = (key_equal)0x0;
              local_2c8 = 0;
              sStack_2c0.pi_ = (sp_counted_base *)0x0;
              puStack_290 = (pointer)((ulong)puStack_290 & 0xffffffffffffff00);
              local_298 = (undefined1  [8])&PTR__lazy_ostream_001b8810;
              local_288 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
              local_280 = "exception std::logic_error expected but not raised";
              local_100 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_f8 = "";
              boost::test_tools::tt_detail::report_assertion();
              boost::detail::shared_count::~shared_count(&sStack_2c0);
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::_M_erase(&local_2b0,
                         local_2b0.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4);
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::_M_erase(&local_2b0,
                         local_2b0.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2);
              if (local_2b0.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_2b0.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar14 = 0;
                witness = local_2b0.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  if ((uVar14 == 4) || (uVar14 == 2)) {
                    uVar14 = uVar14 | 1;
                  }
                  if (local_260.matrix_.matrix_._M_h._M_buckets
                      [(ulong)uVar14 % local_260.matrix_.matrix_._M_h._M_bucket_count] ==
                      (__node_base_ptr)0x0) {
LAB_00166805:
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var4 = local_260.matrix_.matrix_._M_h._M_buckets
                           [(ulong)uVar14 % local_260.matrix_.matrix_._M_h._M_bucket_count]->_M_nxt;
                  uVar1 = *(uint *)&p_Var4[1]._M_nxt;
                  while (uVar14 != uVar1) {
                    p_Var4 = p_Var4->_M_nxt;
                    if ((p_Var4 == (_Hash_node_base *)0x0) ||
                       (uVar1 = *(uint *)&p_Var4[1]._M_nxt,
                       (ulong)uVar1 % local_260.matrix_.matrix_._M_h._M_bucket_count !=
                       (ulong)uVar14 % local_260.matrix_.matrix_._M_h._M_bucket_count))
                    goto LAB_00166805;
                  }
                  get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>
                            ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>
                              *)local_298,
                             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
                              *)(p_Var4 + 2));
                  test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>
                            (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>
                                      *)local_298);
                  uVar14 = uVar14 + 1;
                  std::
                  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)local_298);
                  witness = witness + 1;
                } while (witness !=
                         local_2b0.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              local_298 = (undefined1  [8])0x0;
              puStack_290 = (pointer)0x0;
              local_288 = (_Base_ptr)0x0;
              if (local_260.matrix_.nextInsertIndex_ < 3) {
                local_260.matrix_.nextInsertIndex_ = 3;
              }
              Gudhi::persistence_matrix::
              Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
              ::_container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
                          *)this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_298,2,
                         0);
              if (local_298 != (undefined1  [8])0x0) {
                operator_delete((void *)local_298,(long)local_288 - (long)local_298);
              }
              auVar7._8_8_ = 0;
              auVar7._0_8_ = local_260.matrix_.matrix_._M_h._M_bucket_count;
              uVar13 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar7,0);
              if (local_260.matrix_.matrix_._M_h._M_buckets[uVar13 & 0xffffffff] !=
                  (__node_base_ptr)0x0) {
                p_Var4 = local_260.matrix_.matrix_._M_h._M_buckets[uVar13 & 0xffffffff]->_M_nxt;
                uVar14 = *(uint *)&p_Var4[1]._M_nxt;
                do {
                  if (uVar14 == 2) {
                    local_140 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_138 = "";
                    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,
                               0x34e);
                    local_2d0[0] = (key_equal)0x1;
                    local_2c8 = 0;
                    sStack_2c0.pi_ = (sp_counted_base *)0x0;
                    puStack_290 = (pointer)((ulong)puStack_290 & 0xffffffffffffff00);
                    local_298 = (undefined1  [8])&PTR__lazy_ostream_001b89d0;
                    local_288 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
                    local_280 = "no exceptions thrown by m.get_column(2)";
                    local_160 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_158 = "";
                    boost::test_tools::tt_detail::report_assertion();
                    boost::detail::shared_count::~shared_count(&sStack_2c0);
                    local_1a0 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_198 = "";
                    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,
                               0x34f);
                    auVar8._8_8_ = 0;
                    auVar8._0_8_ = local_260.matrix_.matrix_._M_h._M_bucket_count;
                    uVar13 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar8,0);
                    if (local_260.matrix_.matrix_._M_h._M_buckets[uVar13 & 0xffffffff] !=
                        (__node_base_ptr)0x0) {
                      p_Var4 = local_260.matrix_.matrix_._M_h._M_buckets[uVar13 & 0xffffffff]->
                               _M_nxt;
                      uVar14 = *(uint *)&p_Var4[1]._M_nxt;
                      do {
                        if (uVar14 == 4) {
                          local_1c0 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_1b8 = "";
                          local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                     &local_1c0,0x34f);
                          local_2d0[0] = (key_equal)0x0;
                          local_2c8 = 0;
                          sStack_2c0.pi_ = (sp_counted_base *)0x0;
                          puStack_290 = (pointer)((ulong)puStack_290 & 0xffffffffffffff00);
                          local_298 = (undefined1  [8])&PTR__lazy_ostream_001b8810;
                          local_288 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
                          local_280 = "exception std::logic_error expected but not raised";
                          local_1e0 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_1d8 = "";
                          boost::test_tools::tt_detail::report_assertion();
                          boost::detail::shared_count::~shared_count(&sStack_2c0);
                          pCVar9 = local_260.colSettings_;
                          std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::clear((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)this);
                          pCVar10 = local_260.colSettings_;
                          local_260.matrix_.nextInsertIndex_ = 0;
                          local_260.matrix_.colSettings_ = pCVar9;
                          if ((pool<boost::default_user_allocator_malloc_free> *)
                              local_260.colSettings_ !=
                              (pool<boost::default_user_allocator_malloc_free> *)0x0) {
                            boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
                                      ((pool<boost::default_user_allocator_malloc_free> *)
                                       local_260.colSettings_);
                          }
                          operator_delete(pCVar10,0x38);
                          std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                         *)this);
                          std::
                          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ::~vector(&local_2b0);
                          return;
                        }
                        p_Var4 = p_Var4->_M_nxt;
                      } while ((p_Var4 != (_Hash_node_base *)0x0) &&
                              (uVar14 = *(uint *)&p_Var4[1]._M_nxt,
                              (ulong)uVar14 % local_260.matrix_.matrix_._M_h._M_bucket_count ==
                              uVar13));
                    }
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var4 = p_Var4->_M_nxt;
                } while ((p_Var4 != (_Hash_node_base *)0x0) &&
                        (uVar14 = *(uint *)&p_Var4[1]._M_nxt,
                        (ulong)uVar14 % local_260.matrix_.matrix_._M_h._M_bucket_count == uVar13));
              }
              std::__throw_out_of_range("_Map_base::at");
            }
            p_Var4 = p_Var4->_M_nxt;
          } while ((p_Var4 != (_Hash_node_base *)0x0) &&
                  (uVar14 = *(uint *)&p_Var4[1]._M_nxt,
                  (ulong)uVar14 % local_260.matrix_.matrix_._M_h._M_bucket_count == uVar13));
        }
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var4 = p_Var4->_M_nxt;
    } while ((p_Var4 != (_Hash_node_base *)0x0) &&
            (uVar14 = *(uint *)&p_Var4[1]._M_nxt,
            (ulong)uVar14 % local_260.matrix_.matrix_._M_h._M_bucket_count == uVar13));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_column_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.remove_column(2);
  m.remove_column(4);
  BOOST_CHECK_THROW(m.get_column(2), std::logic_error);
  BOOST_CHECK_THROW(m.get_column(4), std::logic_error);

  columns.erase(columns.begin() + 4);
  columns.erase(columns.begin() + 2);
  unsigned int i = 0;
  for (auto& b : columns) {
    if (i == 2 || i == 4) ++i;
    test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++)));
  }

  if constexpr (!Matrix::Option_list::has_row_access) {
    m.insert_column(witness_content<typename Matrix::Column>{}, 2);
    BOOST_CHECK_NO_THROW(m.get_column(2));
    BOOST_CHECK_THROW(m.get_column(4), std::logic_error);
  }
}